

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

pair<tinyusdz::Path,_tinyusdz::Path> * __thiscall
tinyusdz::Path::split_at_root
          (pair<tinyusdz::Path,_tinyusdz::Path> *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  allocator local_251;
  string p;
  Path rP;
  string local_160;
  string siblings;
  string root;
  Path sP;
  
  if (((this->_prim_part)._M_string_length == 0) || (*(this->_prim_part)._M_dataplus._M_p != '/')) {
    rP._prim_part._M_dataplus._M_p = (pointer)&rP._prim_part.field_2;
    rP._prim_part._M_string_length = 0;
    rP._prim_part.field_2._M_local_buf[0] = '\0';
    rP._prop_part._M_dataplus._M_p = (pointer)&rP._prop_part.field_2;
    rP._prop_part._M_string_length = 0;
    rP._prop_part.field_2._M_local_buf[0] = '\0';
    rP._variant_part._M_dataplus._M_p = (pointer)&rP._variant_part.field_2;
    rP._variant_part._M_string_length = 0;
    rP._variant_part.field_2._M_local_buf[0] = '\0';
    rP._variant_selection_part._M_dataplus._M_p = (pointer)&rP._variant_selection_part.field_2;
    rP._variant_selection_part._M_string_length = 0;
    rP._variant_selection_part.field_2._M_local_buf[0] = '\0';
    rP._variant_part_str._M_dataplus._M_p = (pointer)&rP._variant_part_str.field_2;
    rP._variant_part_str._M_string_length = 0;
    rP._variant_part_str.field_2._M_local_buf[0] = '\0';
    rP._element._M_dataplus._M_p = (pointer)&rP._element.field_2;
    rP._element._M_string_length = 0;
    rP._element.field_2._M_local_buf[0] = '\0';
    rP._path_type.has_value_ = false;
    rP._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    rP._valid = false;
    std::pair<tinyusdz::Path,_tinyusdz::Path>::pair<tinyusdz::Path,_true>
              (__return_storage_ptr__,&rP,this);
    ~Path(&rP);
    return __return_storage_ptr__;
  }
  bVar1 = is_root_path(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)&p,"/",(allocator *)&siblings);
    std::__cxx11::string::string((string *)&root,"",(allocator *)&local_160);
    Path(&rP,&p,&root);
    sP._prim_part._M_dataplus._M_p = (pointer)&sP._prim_part.field_2;
    sP._prim_part._M_string_length = 0;
    sP._prim_part.field_2._M_local_buf[0] = '\0';
    sP._prop_part._M_dataplus._M_p = (pointer)&sP._prop_part.field_2;
    sP._prop_part._M_string_length = 0;
    sP._prop_part.field_2._M_local_buf[0] = '\0';
    sP._variant_part._M_dataplus._M_p = (pointer)&sP._variant_part.field_2;
    sP._variant_part._M_string_length = 0;
    sP._variant_part.field_2._M_local_buf[0] = '\0';
    sP._variant_selection_part._M_dataplus._M_p = (pointer)&sP._variant_selection_part.field_2;
    sP._variant_selection_part._M_string_length = 0;
    sP._variant_selection_part.field_2._M_local_buf[0] = '\0';
    sP._variant_part_str._M_dataplus._M_p = (pointer)&sP._variant_part_str.field_2;
    sP._variant_part_str._M_string_length = 0;
    sP._variant_part_str.field_2._M_local_buf[0] = '\0';
    sP._element._M_dataplus._M_p = (pointer)&sP._element.field_2;
    sP._element._M_string_length = 0;
    sP._element.field_2._M_local_buf[0] = '\0';
    sP._path_type.has_value_ = false;
    sP._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    sP._valid = false;
    std::pair<tinyusdz::Path,_tinyusdz::Path>::pair<tinyusdz::Path,_tinyusdz::Path,_true>
              (__return_storage_ptr__,&rP,&sP);
    ~Path(&sP);
    ~Path(&rP);
    std::__cxx11::string::_M_dispose();
    goto LAB_001261b5;
  }
  full_path_name_abi_cxx11_(&p,this);
  if (1 < p._M_string_length) {
    lVar2 = 0;
    for (lVar3 = (long)(p._M_string_length - 1) >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (p._M_dataplus._M_p[lVar2 + 1] == '/') {
        pcVar4 = p._M_dataplus._M_p + lVar2 + 1;
        goto LAB_0012602f;
      }
      if (p._M_dataplus._M_p[lVar2 + 2] == '/') {
        pcVar4 = p._M_dataplus._M_p + lVar2 + 2;
        goto LAB_0012602f;
      }
      if (p._M_dataplus._M_p[lVar2 + 3] == '/') {
        pcVar4 = p._M_dataplus._M_p + lVar2 + 3;
        goto LAB_0012602f;
      }
      if (p._M_dataplus._M_p[lVar2 + 4] == '/') {
        pcVar4 = p._M_dataplus._M_p + lVar2 + 4;
        goto LAB_0012602f;
      }
      lVar2 = lVar2 + 4;
    }
    pcVar4 = p._M_dataplus._M_p + lVar2 + 1;
    lVar3 = (p._M_string_length - 1) - lVar2;
    if (lVar3 == 1) {
LAB_00126027:
      if (*pcVar4 != '/') {
        pcVar4 = p._M_dataplus._M_p + p._M_string_length;
      }
    }
    else if (lVar3 == 3) {
      if (*pcVar4 != '/') {
        pcVar4 = p._M_dataplus._M_p + lVar2 + 2;
        goto LAB_0012601e;
      }
    }
    else {
      if (lVar3 != 2) goto LAB_00126120;
LAB_0012601e:
      if (*pcVar4 != '/') {
        pcVar4 = pcVar4 + 1;
        goto LAB_00126027;
      }
    }
LAB_0012602f:
    if ((pcVar4 != p._M_dataplus._M_p + p._M_string_length) &&
       (pcVar4 != p._M_dataplus._M_p && -1 < (long)pcVar4 - (long)p._M_dataplus._M_p)) {
      std::__cxx11::string::substr((ulong)&root,(ulong)&p);
      std::__cxx11::string::substr((ulong)&siblings,(ulong)&p);
      std::__cxx11::string::string((string *)&sP,"",(allocator *)&local_160);
      Path(&rP,&root,&sP._prim_part);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string((string *)&local_160,"",&local_251);
      Path(&sP,&siblings,&local_160);
      std::__cxx11::string::_M_dispose();
      std::pair<tinyusdz::Path,_tinyusdz::Path>::pair<tinyusdz::Path_&,_tinyusdz::Path_&,_true>
                (__return_storage_ptr__,&rP,&sP);
      ~Path(&sP);
      ~Path(&rP);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_001261b5;
    }
  }
LAB_00126120:
  rP._prim_part._M_dataplus._M_p = (pointer)&rP._prim_part.field_2;
  rP._prim_part._M_string_length = 0;
  rP._prim_part.field_2._M_local_buf[0] = '\0';
  rP._prop_part._M_dataplus._M_p = (pointer)&rP._prop_part.field_2;
  rP._prop_part._M_string_length = 0;
  rP._prop_part.field_2._M_local_buf[0] = '\0';
  rP._variant_part._M_dataplus._M_p = (pointer)&rP._variant_part.field_2;
  rP._variant_part._M_string_length = 0;
  rP._variant_part.field_2._M_local_buf[0] = '\0';
  rP._variant_selection_part._M_dataplus._M_p = (pointer)&rP._variant_selection_part.field_2;
  rP._variant_selection_part._M_string_length = 0;
  rP._variant_selection_part.field_2._M_local_buf[0] = '\0';
  rP._variant_part_str._M_dataplus._M_p = (pointer)&rP._variant_part_str.field_2;
  rP._variant_part_str._M_string_length = 0;
  rP._variant_part_str.field_2._M_local_buf[0] = '\0';
  rP._element._M_dataplus._M_p = (pointer)&rP._element.field_2;
  rP._element._M_string_length = 0;
  rP._element.field_2._M_local_buf[0] = '\0';
  rP._path_type.has_value_ = false;
  rP._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  rP._valid = false;
  std::pair<tinyusdz::Path,_tinyusdz::Path>::pair<tinyusdz::Path,_true>
            (__return_storage_ptr__,this,&rP);
  ~Path(&rP);
LAB_001261b5:
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::pair<Path, Path> Path::split_at_root() const {
  if (is_absolute_path()) {
    if (is_root_path()) {
      return std::make_pair(Path("/", ""), Path());
    }

    std::string p = full_path_name();

    if (p.size() < 2) {
      // Never should reach here. just in case
      return std::make_pair(*this, Path());
    }

    // Fine 2nd '/'
    auto ret =
        std::find_if(p.begin() + 1, p.end(), [](char c) { return c == '/'; });

    if (ret != p.end()) {
      auto ndist = std::distance(p.begin(), ret);  // distance from str[0]
      if (ndist < 1) {
        // This should not happen though.
        return std::make_pair(*this, Path());
      }
      size_t n = size_t(ndist);
      std::string root = p.substr(0, n);
      std::string siblings = p.substr(n);

      Path rP(root, "");
      Path sP(siblings, "");

      return std::make_pair(rP, sP);
    }

    return std::make_pair(*this, Path());
  } else {
    return std::make_pair(Path(), *this);
  }
}